

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::PrepareProgram
          (EnableDisableAttributesTest *this,bool bind_even_or_odd)

{
  GLuint GVar1;
  char *pcVar2;
  GLuint i_00;
  GLuint i_01;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  string vs_source;
  undefined1 local_128 [8];
  string vs_template;
  allocator<char> local_e1;
  string local_e0 [32];
  string local_c0;
  allocator<char> local_99;
  string local_98 [32];
  uint local_78;
  allocator<char> local_71;
  GLint i;
  string copies;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string declarations;
  bool bind_even_or_odd_local;
  EnableDisableAttributesTest *this_local;
  
  declarations.field_2._M_local_buf[0xf] = bind_even_or_odd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"    sum = 0;\n",&local_71);
  std::allocator<char>::~allocator(&local_71);
  for (local_78 = (uint)(declarations.field_2._M_local_buf[0xf] & 1);
      (int)local_78 < this->m_max_attributes; local_78 = local_78 + 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_98,"in int a_",&local_99);
    Utilities::itoa_abi_cxx11_(&local_c0,(Utilities *)(ulong)local_78,i_00);
    pcVar2 = (char *)std::__cxx11::string::append(local_98);
    std::__cxx11::string::append(pcVar2);
    std::__cxx11::string::append((string *)local_38);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"    sum += a_",&local_e1);
    Utilities::itoa_abi_cxx11_
              ((string *)((long)&vs_template.field_2 + 8),(Utilities *)(ulong)local_78,i_01);
    pcVar2 = (char *)std::__cxx11::string::append(local_e0);
    std::__cxx11::string::append(pcVar2);
    std::__cxx11::string::append((string *)&i);
    std::__cxx11::string::~string((string *)(vs_template.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,
             "#version 450\n\nDECLARATION_TEMPLATEout int sum;\n\nvoid main()\n{\nCOPY_TEMPLATE}\n",
             (allocator<char> *)(vs_source.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(vs_source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"DECLARATION_TEMPLATE",&local_171);
  Utilities::replace((string *)local_150,(string *)local_128,&local_170,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"COPY_TEMPLATE",&local_1b9);
  Utilities::replace(&local_198,(string *)local_150,&local_1b8,(string *)&i);
  std::__cxx11::string::operator=((string *)local_150,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  GVar1 = BuildProgram(this,pcVar2,(bool)(declarations.field_2._M_local_buf[0xf] & 1));
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)local_38);
  return GVar1;
}

Assistant:

glw::GLuint EnableDisableAttributesTest::PrepareProgram(const bool bind_even_or_odd)
{
	/* Preprocess vertex shader sources. */
	std::string declarations = "";
	std::string copies		 = "    sum = 0;\n";

	for (glw::GLint i = (glw::GLint)(bind_even_or_odd); i < m_max_attributes; i += 2)
	{
		declarations.append((std::string("in int a_").append(Utilities::itoa(i))).append(";\n"));
		copies.append((std::string("    sum += a_").append(Utilities::itoa(i))).append(";\n"));
	}

	std::string vs_template(s_vertex_shader_template);

	std::string vs_source = Utilities::replace(vs_template, "DECLARATION_TEMPLATE", declarations);
	vs_source			  = Utilities::replace(vs_source, "COPY_TEMPLATE", copies);

	/* Build and compile. */
	return BuildProgram(vs_source.c_str(), bind_even_or_odd);
}